

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall CoinsViews::InitCache(CoinsViews *this)

{
  long lVar1;
  CCoinsViewCache *pCVar2;
  CCoinsViewCache *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CCoinsViewCache *)operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache(this_00,(CCoinsView *)&this->m_catcherview,false);
  pCVar2 = (this->m_cacheview)._M_t.
           super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
           super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
           super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl;
  (this->m_cacheview)._M_t.
  super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>._M_t.
  super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
  super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl = this_00;
  if (pCVar2 == (CCoinsViewCache *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (**(code **)(*(long *)&(pCVar2->super_CCoinsViewBacked).super_CCoinsView + 0x38))();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CoinsViews::InitCache()
{
    AssertLockHeld(::cs_main);
    m_cacheview = std::make_unique<CCoinsViewCache>(&m_catcherview);
}